

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O0

void * index_tree_next(index_tree_node *node)

{
  bool bVar1;
  index_tree_node *local_18;
  index_tree_node *node_local;
  
  local_18 = node;
  if (node->right == (index_tree_node *)0x0) {
    while( true ) {
      bVar1 = false;
      if (local_18->parent != (index_tree_node *)0x0) {
        bVar1 = local_18->parent->right == local_18;
      }
      if (!bVar1) break;
      local_18 = local_18->parent;
    }
    node_local = local_18->parent;
  }
  else {
    for (local_18 = node->right; local_18->left != (index_tree_node *)0x0; local_18 = local_18->left
        ) {
    }
    node_local = local_18;
  }
  return node_local;
}

Assistant:

static void *
index_tree_next(const index_tree_node *node)
{
	if (node->right != NULL) {
		node = node->right;
		while (node->left != NULL)
			node = node->left;

		return (void *)(node);
	}

	while (node->parent != NULL && node->parent->right == node)
		node = node->parent;

	return (void *)(node->parent);
}